

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<SubArray,_Macro>_>::moveFromSpan
          (Span<QHashPrivate::Node<SubArray,_Macro>_> *this,
          Span<QHashPrivate::Node<SubArray,_Macro>_> *fromSpan,size_t fromIndex,size_t to)

{
  uchar *puVar1;
  uchar *puVar2;
  uchar *puVar3;
  QArrayDataPointer<Symbol> *this_00;
  byte bVar4;
  Entry *pEVar5;
  Entry *pEVar6;
  undefined8 uVar7;
  Data *pDVar8;
  Symbol *pSVar9;
  qsizetype qVar10;
  ulong uVar11;
  ulong uVar12;
  QArrayDataPointer<Symbol> *this_01;
  
  if (this->nextFree == this->allocated) {
    addStorage(this);
  }
  this->offsets[to] = this->nextFree;
  pEVar5 = this->entries;
  uVar11 = (ulong)((uint)this->nextFree * 0x60);
  this->nextFree = (pEVar5->storage).data[uVar11];
  bVar4 = fromSpan->offsets[fromIndex];
  fromSpan->offsets[fromIndex] = 0xff;
  pEVar6 = fromSpan->entries;
  uVar12 = (ulong)((uint)bVar4 * 0x60);
  puVar1 = (pEVar6->storage).data + uVar12;
  puVar2 = (pEVar6->storage).data + uVar12;
  this_01 = (QArrayDataPointer<Symbol> *)(puVar2 + 0x30);
  puVar2[0] = '\0';
  puVar2[1] = '\0';
  puVar2[2] = '\0';
  puVar2[3] = '\0';
  puVar2[4] = '\0';
  puVar2[5] = '\0';
  puVar2[6] = '\0';
  puVar2[7] = '\0';
  *(undefined8 *)((pEVar5->storage).data + uVar11) = *(undefined8 *)puVar2;
  uVar7 = *(undefined8 *)(puVar2 + 8);
  puVar2[8] = '\0';
  puVar2[9] = '\0';
  puVar2[10] = '\0';
  puVar2[0xb] = '\0';
  puVar2[0xc] = '\0';
  puVar2[0xd] = '\0';
  puVar2[0xe] = '\0';
  puVar2[0xf] = '\0';
  *(undefined8 *)((pEVar5->storage).data + uVar11 + 8) = uVar7;
  uVar7 = *(undefined8 *)(puVar2 + 0x10);
  puVar2[0x10] = '\0';
  puVar2[0x11] = '\0';
  puVar2[0x12] = '\0';
  puVar2[0x13] = '\0';
  puVar2[0x14] = '\0';
  puVar2[0x15] = '\0';
  puVar2[0x16] = '\0';
  puVar2[0x17] = '\0';
  *(undefined8 *)((pEVar5->storage).data + uVar11 + 0x10) = uVar7;
  uVar7 = *(undefined8 *)(puVar2 + 0x20);
  puVar3 = (pEVar5->storage).data + uVar11 + 0x18;
  *(undefined8 *)puVar3 = *(undefined8 *)(puVar2 + 0x18);
  *(undefined8 *)(puVar3 + 8) = uVar7;
  *(undefined2 *)((pEVar5->storage).data + uVar11 + 0x28) = *(undefined2 *)(puVar2 + 0x28);
  pDVar8 = this_01->d;
  this_01->d = (Data *)0x0;
  *(Data **)((pEVar5->storage).data + uVar11 + 0x30) = pDVar8;
  uVar7 = *(undefined8 *)(puVar2 + 0x38);
  puVar2[0x38] = '\0';
  puVar2[0x39] = '\0';
  puVar2[0x3a] = '\0';
  puVar2[0x3b] = '\0';
  puVar2[0x3c] = '\0';
  puVar2[0x3d] = '\0';
  puVar2[0x3e] = '\0';
  puVar2[0x3f] = '\0';
  *(undefined8 *)((pEVar5->storage).data + uVar11 + 0x38) = uVar7;
  uVar7 = *(undefined8 *)(puVar2 + 0x40);
  puVar2[0x40] = '\0';
  puVar2[0x41] = '\0';
  puVar2[0x42] = '\0';
  puVar2[0x43] = '\0';
  puVar2[0x44] = '\0';
  puVar2[0x45] = '\0';
  puVar2[0x46] = '\0';
  puVar2[0x47] = '\0';
  *(undefined8 *)((pEVar5->storage).data + uVar11 + 0x40) = uVar7;
  this_00 = (QArrayDataPointer<Symbol> *)((pEVar6->storage).data + uVar12 + 0x48);
  pDVar8 = this_00->d;
  this_00->d = (Data *)0x0;
  *(Data **)((pEVar5->storage).data + uVar11 + 0x48) = pDVar8;
  pSVar9 = this_00->ptr;
  this_00->ptr = (Symbol *)0x0;
  *(Symbol **)((pEVar5->storage).data + uVar11 + 0x50) = pSVar9;
  qVar10 = this_00->size;
  this_00->size = 0;
  *(qsizetype *)((pEVar5->storage).data + uVar11 + 0x58) = qVar10;
  QArrayDataPointer<Symbol>::~QArrayDataPointer(this_00);
  QArrayDataPointer<Symbol>::~QArrayDataPointer(this_01);
  pDVar8 = this_00[-3].d;
  if (pDVar8 != (Data *)0x0) {
    LOCK();
    (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(*(QArrayData **)puVar1,1,0x10);
    }
  }
  *puVar1 = fromSpan->nextFree;
  fromSpan->nextFree = bVar4;
  return;
}

Assistant:

void moveFromSpan(Span &fromSpan, size_t fromIndex, size_t to) noexcept(std::is_nothrow_move_constructible_v<Node>)
    {
        Q_ASSERT(to < SpanConstants::NEntries);
        Q_ASSERT(offsets[to] == SpanConstants::UnusedEntry);
        Q_ASSERT(fromIndex < SpanConstants::NEntries);
        Q_ASSERT(fromSpan.offsets[fromIndex] != SpanConstants::UnusedEntry);
        if (nextFree == allocated)
            addStorage();
        Q_ASSERT(nextFree < allocated);
        offsets[to] = nextFree;
        Entry &toEntry = entries[nextFree];
        nextFree = toEntry.nextFree();

        size_t fromOffset = fromSpan.offsets[fromIndex];
        fromSpan.offsets[fromIndex] = SpanConstants::UnusedEntry;
        Entry &fromEntry = fromSpan.entries[fromOffset];

        if constexpr (isRelocatable<Node>()) {
            memcpy(&toEntry, &fromEntry, sizeof(Entry));
        } else {
            new (&toEntry.node()) Node(std::move(fromEntry.node()));
            fromEntry.node().~Node();
        }
        fromEntry.nextFree() = fromSpan.nextFree;
        fromSpan.nextFree = static_cast<unsigned char>(fromOffset);
    }